

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLowerGraph.cpp
# Opt level: O1

void PrintFunction(InstructionRegVmLowerGraphContext *ctx,RegVmLoweredModule *lowModule,
                  RegVmLoweredFunction *lowFunction)

{
  uint uVar1;
  VmValueType VVar2;
  FunctionData *pFVar3;
  ArgumentData *pAVar4;
  long lVar5;
  long lVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ScopeData *pSVar9;
  VariableData *pVVar10;
  char *pcVar11;
  VmConstant *pVVar12;
  VmConstant *pVVar13;
  ModuleData *pMVar14;
  ulong uVar15;
  char *pcVar16;
  char *pcVar17;
  ulong uVar18;
  long lVar19;
  bool bVar20;
  ulong uVar21;
  ulong uVar22;
  VmValue *pVVar23;
  ulong uVar24;
  
  pFVar3 = lowFunction->vmFunction->function;
  if (pFVar3 == (FunctionData *)0x0) {
    PrintLine(ctx->output,"function global()");
  }
  else {
    pcVar17 = (pFVar3->name->name).begin;
    Print(ctx->output,"function %.*s.f%04x(",
          (ulong)(uint)(*(int *)&(pFVar3->name->name).end - (int)pcVar17),pcVar17,
          (ulong)pFVar3->uniqueId);
    if ((pFVar3->arguments).count != 0) {
      lVar19 = 0;
      uVar24 = 0;
      do {
        pAVar4 = (pFVar3->arguments).data;
        pcVar17 = ", ";
        if (lVar19 == 0) {
          pcVar17 = "";
        }
        pcVar16 = "";
        if ((&pAVar4->isExplicit)[lVar19] != false) {
          pcVar16 = "explicit ";
        }
        lVar5 = *(long *)((long)&pAVar4->name + lVar19);
        lVar6 = *(long *)((long)&pAVar4->type + lVar19);
        uVar7 = *(undefined8 *)(lVar6 + 0x10);
        uVar8 = *(undefined8 *)(lVar5 + 0x40);
        Print(ctx->output,"%s%s%.*s %.*s",pcVar17,pcVar16,
              (ulong)(uint)(*(int *)(lVar6 + 0x18) - (int)uVar7),uVar7,
              (ulong)(uint)(*(int *)(lVar5 + 0x48) - (int)uVar8),uVar8);
        uVar24 = uVar24 + 1;
        lVar19 = lVar19 + 0x30;
      } while (uVar24 < (pFVar3->arguments).count);
    }
    PrintLine(ctx->output,")");
    PrintLine(ctx->output,"// argument size %lld",pFVar3->argumentsSize);
    PrintLine(ctx->output,"// stack size %lld",pFVar3->stackSize);
    uVar1 = pFVar3->vmFunction->regVmRegisters;
    PrintLine(ctx->output,"// register count %d (r0-r%d)",(ulong)uVar1,(ulong)(uVar1 - 1));
  }
  pSVar9 = lowFunction->vmFunction->scope;
  if ((pSVar9 != (ScopeData *)0x0) && ((pSVar9->allVariables).count != 0)) {
    uVar24 = 0;
    do {
      pVVar10 = (pSVar9->allVariables).data[uVar24];
      if ((pVVar10->isAlloca != true) || ((pVVar10->users).count != 0)) {
        pcVar17 = "imported ";
        if (pVVar10->importModule == (ModuleData *)0x0) {
          pcVar17 = "";
        }
        pcVar16 = (pVVar10->type->name).begin;
        pcVar11 = (pVVar10->name->name).begin;
        Print(ctx->output,"// %s0x%x: %.*s %.*s",pcVar17,(ulong)pVVar10->offset,
              (ulong)(uint)(*(int *)&(pVVar10->type->name).end - (int)pcVar16),pcVar16,
              (ulong)(uint)(*(int *)&(pVVar10->name->name).end - (int)pcVar11),pcVar11);
        uVar15 = (ulong)(pVVar10->users).count;
        if (uVar15 == 0) {
LAB_001aa295:
          Print(ctx->output," noalias");
        }
        else {
          uVar18 = 0;
          bVar20 = false;
          do {
            pVVar12 = (pVVar10->users).data[uVar18];
            uVar21 = (ulong)(pVVar12->super_VmValue).users.count;
            if (uVar21 != 0) {
              uVar22 = 0;
              do {
                pVVar23 = (pVVar12->super_VmValue).users.data[uVar22];
                if ((pVVar23 == (VmValue *)0x0) || (pVVar23->typeID != 2)) {
                  pVVar23 = (VmValue *)0x0;
                }
                if (pVVar23 == (VmValue *)0x0) {
                  __assert_fail("!\"invalid constant use\"",
                                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLowerGraph.cpp"
                                ,0x3a3,
                                "void PrintFunction(InstructionRegVmLowerGraphContext &, RegVmLoweredModule *, RegVmLoweredFunction *)"
                               );
                }
                uVar1 = *(uint *)&pVVar23[1]._vptr_VmValue;
                if (6 < uVar1) {
                  if (uVar1 - 8 < 7) {
                    if (pVVar23[1].type.type == VM_TYPE_VOID) goto LAB_001aa3a7;
                    if ((VmConstant *)**(long **)&pVVar23[1].typeID == pVVar12) goto LAB_001aa277;
                  }
                  if (uVar1 == 0x1a) {
                    if (pVVar23[1].type.type == VM_TYPE_VOID) goto LAB_001aa3a7;
                    pVVar13 = (VmConstant *)**(long **)&pVVar23[1].typeID;
joined_r0x001aa23a:
                    if (pVVar13 == pVVar12) goto LAB_001aa277;
                  }
                  else if (uVar1 == 0x1b) {
                    VVar2 = pVVar23[1].type.type;
                    if (VVar2 == VM_TYPE_VOID) goto LAB_001aa3a7;
                    if ((VmConstant *)**(long **)&pVVar23[1].typeID == pVVar12) goto LAB_001aa277;
                    if (VVar2 < VM_TYPE_LONG) goto LAB_001aa3a7;
                    pVVar13 = (VmConstant *)(*(long **)&pVVar23[1].typeID)[2];
                    goto joined_r0x001aa23a;
                  }
                  if ((1 < uVar1 - 0x1f) || (pVVar12->isReference == false)) {
                    if (uVar1 - 0x33 < 0x11) {
                      if (pVVar23[1].type.type < VM_TYPE_DOUBLE) {
LAB_001aa3a7:
                        __assert_fail("index < count",
                                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                                      ,0x199,
                                      "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]"
                                     );
                      }
                      if (*(VmConstant **)(*(long *)&pVVar23[1].typeID + 8) == pVVar12)
                      goto LAB_001aa277;
                    }
                    bVar20 = true;
                  }
                }
LAB_001aa277:
                uVar22 = uVar22 + 1;
              } while (uVar21 != uVar22);
            }
            uVar18 = uVar18 + 1;
          } while (uVar18 != uVar15);
          if (!bVar20) goto LAB_001aa295;
        }
        if (pVVar10->isAlloca == true) {
          Print(ctx->output," alloca");
        }
        pMVar14 = pVVar10->importModule;
        if (pMVar14 != (ModuleData *)0x0) {
          Print(ctx->output," from \'%.*s\'",
                (ulong)(uint)(*(int *)&(pMVar14->name).end - (int)(pMVar14->name).begin));
        }
        OutputContext::Print(ctx->output,"\n",1);
      }
      uVar24 = uVar24 + 1;
    } while (uVar24 < (pSVar9->allVariables).count);
  }
  PrintLine(ctx->output,"{");
  if ((lowFunction->blocks).count != 0) {
    uVar24 = 0;
    do {
      PrintBlock(ctx,lowModule,(lowFunction->blocks).data[uVar24]);
      uVar24 = uVar24 + 1;
    } while (uVar24 < (lowFunction->blocks).count);
  }
  PrintLine(ctx->output,"}");
  OutputContext::Print(ctx->output,"\n",1);
  return;
}

Assistant:

void PrintFunction(InstructionRegVmLowerGraphContext &ctx, RegVmLoweredModule *lowModule, RegVmLoweredFunction *lowFunction)
{
	if(FunctionData *fData = lowFunction->vmFunction->function)
	{
		Print(ctx.output, "function %.*s.f%04x(", FMT_ISTR(fData->name->name), fData->uniqueId);

		for(unsigned i = 0; i < fData->arguments.size(); i++)
		{
			ArgumentData &argument = fData->arguments[i];

			Print(ctx.output, "%s%s%.*s %.*s", i == 0 ? "" : ", ", argument.isExplicit ? "explicit " : "", FMT_ISTR(argument.type->name), FMT_ISTR(argument.name->name));
		}

		PrintLine(ctx.output, ")");

		PrintLine(ctx.output, "// argument size %lld", fData->argumentsSize);
		PrintLine(ctx.output, "// stack size %lld", fData->stackSize);
		PrintLine(ctx.output, "// register count %d (r0-r%d)", fData->vmFunction->regVmRegisters, fData->vmFunction->regVmRegisters - 1);
	}
	else
	{
		PrintLine(ctx.output, "function global()");
	}

	if(ScopeData *scope = lowFunction->vmFunction->scope)
	{
		for(unsigned i = 0; i < scope->allVariables.size(); i++)
		{
			VariableData *variable = scope->allVariables[i];

			if(variable->isAlloca && variable->users.empty())
				continue;

			Print(ctx.output, "// %s0x%x: %.*s %.*s", variable->importModule ? "imported " : "", variable->offset, FMT_ISTR(variable->type->name), FMT_ISTR(variable->name->name));

			bool addressTaken = false;

			for(unsigned i = 0; i < variable->users.size(); i++)
			{
				VmConstant *user = variable->users[i];

				for(unsigned k = 0; k < user->users.size(); k++)
				{
					if(VmInstruction *inst = getType<VmInstruction>(user->users[k]))
					{
						bool simpleUse = false;

						if(inst->cmd >= VM_INST_LOAD_BYTE && inst->cmd <= VM_INST_LOAD_STRUCT)
							simpleUse = true;
						else if(inst->cmd >= VM_INST_STORE_BYTE && inst->cmd <= VM_INST_STORE_STRUCT && inst->arguments[0] == user)
							simpleUse = true;
						else if(inst->cmd == VM_INST_MEM_COPY && (inst->arguments[0] == user || inst->arguments[2] == user))
							simpleUse = true;
						else if(inst->cmd == VM_INST_SET_RANGE && inst->arguments[0] == user)
							simpleUse = true;
						else if((inst->cmd == VM_INST_RETURN || inst->cmd == VM_INST_CALL) && user->isReference)
							simpleUse = true;
						else if(inst->cmd >= VM_INST_ADD_LOAD && inst->cmd <= VM_INST_BIT_XOR_LOAD && inst->arguments[1] == user)
							simpleUse = true;
						else
							simpleUse = false;

						if(!simpleUse)
							addressTaken = true;
					}
					else
					{
						assert(!"invalid constant use");
					}
				}
			}

			if(!addressTaken)
				Print(ctx.output, " noalias");

			if(variable->isAlloca)
				Print(ctx.output, " alloca");

			if(variable->importModule)
				Print(ctx.output, " from '%.*s'", FMT_ISTR(variable->importModule->name));

			PrintLine(ctx.output);
		}
	}

	PrintLine(ctx.output, "{");

	for(unsigned i = 0; i < lowFunction->blocks.size(); i++)
		PrintBlock(ctx, lowModule, lowFunction->blocks[i]);

	PrintLine(ctx.output, "}");
	PrintLine(ctx.output);
}